

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so3.hpp
# Opt level: O3

Transformation *
Sophus::SO3Base<Sophus::SO3<float,_0>_>::hat(Transformation *__return_storage_ptr__,Tangent *omega)

{
  float *s;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar1;
  Scalar local_4c;
  Scalar local_48;
  float local_44;
  Scalar local_40;
  float local_3c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_38;
  
  local_38.m_row = 0;
  local_38.m_col = 1;
  local_38.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = 0.0;
  local_3c = -(omega->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_38.m_xpr = __return_storage_ptr__;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_38,&local_3c);
  s = (omega->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
      1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar1,s);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(omega->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + 2);
  local_40 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_40);
  local_44 = -(omega->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_44);
  local_48 = -*s;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_48);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(Scalar *)omega);
  local_4c = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_4c);
  if ((local_38.m_currentBlockRows + local_38.m_row == 3) && (local_38.m_col == 3)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
               );
}

Assistant:

hat(Tangent const& omega) {
    Transformation Omega;
    // clang-format off
    Omega <<
        Scalar(0), -omega(2),  omega(1),
         omega(2), Scalar(0), -omega(0),
        -omega(1),  omega(0), Scalar(0);
    // clang-format on
    return Omega;
  }